

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O1

bool __thiscall ShParser::parseParameters(ShParser *this,Parser *parser,tShOpcode *opcode)

{
  byte bVar1;
  ShParser *__s;
  size_t __n;
  char *pcVar2;
  char *pcVar3;
  undefined2 uVar4;
  int iVar5;
  byte *pbVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Token *pTVar10;
  size_t __n_00;
  undefined8 extraout_RAX;
  undefined8 uVar11;
  char **ppcVar12;
  byte *pbVar13;
  char *encoding;
  byte *local_90;
  allocator<char> local_85;
  uint local_84;
  ShParser *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ShImmediateData *local_68;
  Expression *local_60;
  _Alloc_hider local_58;
  ShParser *local_50;
  undefined1 local_48 [24];
  
  local_90 = (byte *)opcode->encoding;
  (this->immediate).primary.type = None;
  local_80 = this;
  if (*local_90 != 0) {
    local_68 = &this->immediate;
    local_78._M_allocated_capacity = (size_type)&(this->registers).grt;
    local_60 = &(this->immediate).primary.expression;
    local_78._8_8_ = parser;
    local_58._M_p = (pointer)opcode;
    do {
      if ((opcode->flags & 8) == 0) {
LAB_0016fca5:
        pbVar6 = local_90;
        pbVar13 = local_90 + 1;
        bVar1 = *local_90;
        local_90 = pbVar13;
        if (bVar1 < 0x73) {
          if (bVar1 == 0x40) {
            pTVar10 = Tokenizer::peekToken
                                ((parser->entries).
                                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
            if (pTVar10->type != Identifier) {
              return false;
            }
            this = (ShParser *)
                   (parser->entries).
                   super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1].tokenizer;
            pTVar10 = Tokenizer::peekToken((Tokenizer *)this,0);
            if (*(__index_type *)
                 ((long)&(pTVar10->value).
                         super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                         .
                         super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                 + 0x20) != '\x04') {
LAB_0016fe52:
              __assert_fail("std::holds_alternative<Identifier>(value)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                            ,0x4d,"const Identifier &Token::identifierValue() const");
            }
            if (**(char **)&(pTVar10->value).
                            super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            .
                            super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                            ._M_u != '@') {
              return false;
            }
            bVar1 = *pbVar13;
            if (bVar1 < 0x73) {
              if ((bVar1 != 0x28) && (bVar1 != 0x2d)) {
                return false;
              }
              this = (ShParser *)
                     (parser->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
              Tokenizer::eatTokens((Tokenizer *)this,1);
              bVar7 = matchSymbol(this,parser,*pbVar13);
            }
            else {
              uVar11 = local_80;
              if ((bVar1 != 0x73) && (uVar11 = local_78._M_allocated_capacity, bVar1 != 0x74)) {
                return false;
              }
              (((ShParser *)uVar11)->registers).grs.type = Normal;
              bVar7 = parseRegisterTable(this,parser,(ShRegisterValue *)uVar11,shRegisters,0x20);
            }
            if (bVar7 == false) {
              return false;
            }
            local_90 = pbVar6 + 2;
            goto LAB_0016fdba;
          }
          if (bVar1 != 0x69) goto LAB_0016fd08;
          bVar7 = parseImmediate(this,parser,local_60);
          if (!bVar7) {
            return false;
          }
          this = (ShParser *)&local_90;
          bVar7 = decodeImmediateSize((char **)this,(ShImmediateType *)local_68);
        }
        else {
          uVar11 = local_80;
          if ((bVar1 == 0x73) || (uVar11 = local_78._M_allocated_capacity, bVar1 == 0x74)) {
            (((ShParser *)uVar11)->registers).grs.type = Normal;
            bVar7 = parseRegisterTable(this,parser,(ShRegisterValue *)uVar11,shRegisters,0x20);
          }
          else {
LAB_0016fd08:
            bVar7 = matchSymbol(this,parser,bVar1);
          }
        }
        if (bVar7 == false) {
          return false;
        }
      }
      else {
        this = (ShParser *)
               (parser->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer;
        local_84 = 0;
        pTVar10 = Tokenizer::peekToken((Tokenizer *)this,0);
        ppcVar12 = shSpecialForcedRegisters;
        pbVar13 = local_90;
        do {
          __s = (ShParser *)*ppcVar12;
          if (__s == (ShParser *)0x0) break;
          __n_00 = strlen((char *)__s);
          this = __s;
          iVar8 = bcmp(__s,pbVar13,__n_00);
          if (iVar8 == 0) {
            if (pTVar10->type == Identifier) {
              if (*(__index_type *)
                   ((long)&(pTVar10->value).
                           super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                           .
                           super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   + 0x20) != '\x04') goto LAB_0016fe52;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,(char *)__s,&local_85);
              __n = *(size_t *)
                     ((long)&(pTVar10->value).
                             super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                             .
                             super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     + 8);
              if (__n == local_48._0_8_) {
                if (__n == 0) {
                  bVar7 = true;
                }
                else {
                  iVar9 = bcmp(*(void **)&(pTVar10->value).
                                          super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                          .
                                          super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                          .
                                          super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                          .
                                          super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                          .
                                          super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                          .
                                          super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                          ._M_u,local_50,__n);
                  bVar7 = iVar9 == 0;
                }
              }
              else {
                bVar7 = false;
              }
              this = local_50;
              if (local_50 != (ShParser *)(local_48 + 8)) {
                operator_delete(local_50,local_48._8_8_ + 1);
              }
              if (bVar7) {
                pbVar13 = pbVar13 + __n_00;
                this = (ShParser *)(*(pointer *)(local_78._8_8_ + 8))[-1].tokenizer;
                local_90 = pbVar13;
                Tokenizer::eatTokens((Tokenizer *)this,1);
                local_84 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
            }
          }
          else {
            ppcVar12 = ppcVar12 + 1;
          }
        } while (iVar8 != 0);
        opcode = (tShOpcode *)local_58._M_p;
        parser = (Parser *)local_78._8_8_;
        if ((local_84 & 1) == 0) goto LAB_0016fca5;
      }
LAB_0016fdba:
    } while (*local_90 != 0);
  }
  pcVar2 = opcode->name;
  pcVar3 = opcode->encoding;
  uVar4 = *(undefined2 *)&opcode->field_0x12;
  iVar8 = opcode->format;
  iVar9 = opcode->archs;
  iVar5 = opcode->flags;
  (local_80->opcodeData).opcode.base = opcode->base;
  *(undefined2 *)&(local_80->opcodeData).opcode.field_0x12 = uVar4;
  (local_80->opcodeData).opcode.format = iVar8;
  (local_80->opcodeData).opcode.archs = iVar9;
  (local_80->opcodeData).opcode.flags = iVar5;
  (local_80->opcodeData).opcode.name = pcVar2;
  (local_80->opcodeData).opcode.encoding = pcVar3;
  pTVar10 = Tokenizer::nextToken
                      ((parser->entries).
                       super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  return pTVar10->type == Separator;
}

Assistant:

bool ShParser::parseParameters(Parser& parser, const tShOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = ShImmediateType::None;

	while (*encoding != 0)
	{
		// Some registers in instructions are forced
		// and do not have a numerical representation (except for r0.)
		// This handles said forced registers.
		if (opcode.flags & SH_FREG)
		{
			const char **fReg = shSpecialForcedRegisters;
			const Token &token = parser.peekToken();
			bool skip = false;
			while (*fReg)
			{
				size_t length = strlen(*fReg);
				if (memcmp(*fReg, encoding, length) == 0)
				{
					if (token.type != TokenType::Identifier)
						break;

					const auto &identifier = token.identifierValue();
					if (identifier.string() == std::string(*fReg))
					{
						skip = true;
						encoding += length;
						parser.eatToken();
						break;
					}
					break;
				}
				fReg += 1;
			}
			if (skip)
				continue;
		}

		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case '@':
			// '@' is not a separate token, and at the same time it's
			// part of the SuperH instruction parameter scheme,
			// so I came up with this rather ugly solution to handle it. 
			if (parser.peekToken().type != TokenType::Identifier)
				return false;
			if (parser.peekToken().identifierValue().string()[0] != '@')
				return false;
			if (*encoding == 't')
			{
				CHECK(parseRegister(parser,registers.grt));
			}
			else if (*encoding == 's')
			{
				CHECK(parseRegister(parser,registers.grs));
			}
			else if (*encoding == '(' || *encoding == '-') // "mov.* r0,@(i4,t)", "mov.* s,@-t" and the others
			{
				parser.eatToken();
				CHECK(matchSymbol(parser, *encoding));
			}
			else
			{
				return false;
			}
			encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}